

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  int32_t iVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  EnumValueDescriptorProto *proto_00;
  EnumDescriptorProto_EnumReservedRange *pEVar6;
  EnumOptions *this_00;
  undefined8 *puVar7;
  int i;
  long lVar8;
  int i_1;
  long lVar9;
  int i_2;
  
  uVar3 = *(undefined8 *)(this + 8);
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  uVar4 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar7 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar7 = (undefined8 *)*puVar7;
  }
  internal::ArenaStringPtr::Set(&proto->name_,uVar3,puVar7);
  lVar9 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(this + 4); lVar8 = lVar8 + 1) {
    lVar5 = *(long *)(this + 0x28);
    proto_00 = RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::Add(&proto->value_);
    EnumValueDescriptor::CopyTo((EnumValueDescriptor *)(lVar5 + lVar9),proto_00);
    lVar9 = lVar9 + 0x20;
  }
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x30); lVar8 = lVar8 + 1) {
    pEVar6 = RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::Add
                       (&proto->reserved_range_);
    lVar9 = *(long *)(this + 0x38);
    iVar1 = *(int32_t *)(lVar9 + lVar8 * 8);
    uVar2 = (pEVar6->_has_bits_).has_bits_[0];
    (pEVar6->_has_bits_).has_bits_[0] = uVar2 | 1;
    pEVar6->start_ = iVar1;
    iVar1 = *(int32_t *)(lVar9 + 4 + lVar8 * 8);
    (pEVar6->_has_bits_).has_bits_[0] = uVar2 | 3;
    pEVar6->end_ = iVar1;
  }
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x34); lVar8 = lVar8 + 1) {
    EnumDescriptorProto::add_reserved_name(proto,*(string **)(*(long *)(this + 0x40) + lVar8 * 8));
  }
  if (*(undefined1 **)(this + 0x20) != _EnumOptions_default_instance_) {
    this_00 = EnumDescriptorProto::_internal_mutable_options(proto);
    EnumOptions::CopyFrom(this_00,*(EnumOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    EnumDescriptorProto::EnumReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &EnumOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}